

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O1

int GetLabels(void *hPtr,char ***labels)

{
  size_type sVar1;
  uint uVar2;
  char **ppcVar3;
  char *pcVar4;
  ulong uVar5;
  shared_ptr<const_fasttext::Dictionary> dict;
  string label;
  Dictionary *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50;
  
  fasttext::FastText::getDictionary((FastText *)hPtr);
  uVar2 = fasttext::Dictionary::nlabels(local_60);
  uVar5 = 0xffffffffffffffff;
  if (0 < (int)uVar2) {
    uVar5 = (long)(int)uVar2 << 3;
  }
  ppcVar3 = (char **)operator_new__(uVar5);
  *ppcVar3 = (char *)0x0;
  memset(ppcVar3 + 1,0,uVar5 - 8);
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      fasttext::Dictionary::getLabel_abi_cxx11_(&local_50,local_60,(int32_t)uVar5);
      sVar1 = local_50._M_string_length;
      pcVar4 = (char *)operator_new__(local_50._M_string_length + 1);
      ppcVar3[uVar5] = pcVar4;
      std::__cxx11::string::copy((char *)&local_50,(ulong)pcVar4,sVar1);
      ppcVar3[uVar5][sVar1] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  *labels = ppcVar3;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return uVar2;
}

Assistant:

GetLabels(void* hPtr, char*** labels)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    auto dict = fastText->getDictionary();
    int numLabels = dict->nlabels();
    auto localLabels = new char*[numLabels] {nullptr};

    for (int i = 0; i < numLabels; ++i)
    {
        auto label = dict->getLabel(i);
        auto len = label.length();
        localLabels[i] = new char[len + 1];
        label.copy(localLabels[i], len);
        localLabels[i][len] = '\0';
    }

    *labels = localLabels;
    return numLabels;
}